

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Name> * __thiscall
wasm::WATParser::ParseDefsCtx::getTagFromName
          (Result<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *this,Name name)

{
  Tag *pTVar1;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Err local_58;
  ParseDefsCtx *local_38;
  char *local_30;
  ParseDefsCtx *local_28;
  ParseDefsCtx *this_local;
  Name name_local;
  
  local_30 = name.super_IString.str._M_str;
  local_38 = name.super_IString.str._M_len;
  local_28 = this;
  this_local = local_38;
  name_local.super_IString.str._M_len = (size_t)local_30;
  name_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  pTVar1 = Module::getTagOrNull(this->wasm,name);
  if (pTVar1 == (Tag *)0x0) {
    IString::toString_abi_cxx11_(&local_b8,(IString *)&this_local);
    std::operator+(&local_98,"tag $",&local_b8);
    std::operator+(&local_78,&local_98," does not exist");
    Lexer::err(&local_58,&this->in,&local_78);
    Result<wasm::Name>::Result(__return_storage_ptr__,&local_58);
    wasm::Err::~Err(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    Result<wasm::Name>::Result<wasm::Name>(__return_storage_ptr__,(Name *)&this_local);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Name> getTagFromName(Name name) {
    if (!wasm.getTagOrNull(name)) {
      return in.err("tag $" + name.toString() + " does not exist");
    }
    return name;
  }